

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O1

bool __thiscall sglr::pdec::ShaderProgramDeclaration::valid(ShaderProgramDeclaration *this)

{
  GeometryShaderInputType GVar1;
  GeometryShaderOutputType GVar2;
  
  if (((this->m_vertexShaderSet == true) && (this->m_fragmentShaderSet == true)) &&
     ((this->m_fragmentOutputs).
      super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_fragmentOutputs).
      super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    GVar1 = (this->m_geometryDecl).inputType;
    GVar2 = (this->m_geometryDecl).outputType;
    if (this->m_geometryShaderSet == true) {
      if (GVar1 != GEOMETRYSHADERINPUTTYPE_LAST && GVar2 != GEOMETRYSHADEROUTPUTTYPE_LAST) {
        return true;
      }
    }
    else if (((GVar1 == GEOMETRYSHADERINPUTTYPE_LAST) && (GVar2 == GEOMETRYSHADEROUTPUTTYPE_LAST))
            && (((this->m_geometryDecl).numOutputVertices == 0 &&
                ((this->m_geometryDecl).numInvocations == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ShaderProgramDeclaration::valid (void) const
{
	if (!m_vertexShaderSet || !m_fragmentShaderSet)
		return false;

	if (m_fragmentOutputs.empty())
		return false;

	if (hasGeometryShader())
	{
		if (m_geometryDecl.inputType == rr::GEOMETRYSHADERINPUTTYPE_LAST ||
			m_geometryDecl.outputType == rr::GEOMETRYSHADEROUTPUTTYPE_LAST)
			return false;
	}
	else
	{
		if (m_geometryDecl.inputType != rr::GEOMETRYSHADERINPUTTYPE_LAST ||
			m_geometryDecl.outputType != rr::GEOMETRYSHADEROUTPUTTYPE_LAST ||
			m_geometryDecl.numOutputVertices != 0 ||
			m_geometryDecl.numInvocations != 0)
			return false;
	}

	return true;
}